

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ClearOutputData(ImFont *this)

{
  ImVector<ImFontGlyph> *in_RDI;
  
  in_RDI[1].Capacity = 0;
  in_RDI[1].Size = 0;
  ImVector<ImFontGlyph>::clear(in_RDI);
  ImVector<float>::clear((ImVector<float> *)in_RDI);
  ImVector<unsigned_short>::clear((ImVector<unsigned_short> *)in_RDI);
  in_RDI[3].Data = (ImFontGlyph *)0x0;
  in_RDI[4].Size = 0;
  in_RDI[4].Capacity = 0;
  *(undefined1 *)&in_RDI[6].Size = 1;
  *(undefined4 *)((long)&in_RDI[6].Data + 4) = 0;
  *(undefined4 *)&in_RDI[6].Data = 0;
  in_RDI[7].Size = 0;
  return;
}

Assistant:

void    ImFont::ClearOutputData()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    Glyphs.clear();
    IndexAdvanceX.clear();
    IndexLookup.clear();
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    DirtyLookupTables = true;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
}